

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

SinhLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_sinh(NeuralNetworkLayer *this)

{
  ulong uVar1;
  LayerUnion LVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] == 0x2ee) {
    LVar2 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x2ee;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    LVar2.sinh_ = google::protobuf::Arena::
                  CreateMaybeMessage<CoreML::Specification::SinhLayerParams>(arena);
    (this->layer_).sinh_ = (SinhLayerParams *)LVar2;
  }
  return (SinhLayerParams *)LVar2.convolution_;
}

Assistant:

inline ::CoreML::Specification::SinhLayerParams* NeuralNetworkLayer::_internal_mutable_sinh() {
  if (!_internal_has_sinh()) {
    clear_layer();
    set_has_sinh();
    layer_.sinh_ = CreateMaybeMessage< ::CoreML::Specification::SinhLayerParams >(GetArenaForAllocation());
  }
  return layer_.sinh_;
}